

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.h
# Opt level: O0

T __thiscall
util::Result<result_tests::NoCopy>::value_or<int>
          (Result<result_tests::NoCopy> *this,int *default_value)

{
  long lVar1;
  bool bVar2;
  Result<result_tests::NoCopy> *in_RSI;
  unique_ptr<int,_std::default_delete<int>_> in_RDI;
  long in_FS_OFFSET;
  __uniq_ptr_impl<int,_std::default_delete<int>_> this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl =
       (tuple<int_*,_std::default_delete<int>_>)
       (tuple<int_*,_std::default_delete<int>_>)
       in_RDI._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl;
  bVar2 = has_value((Result<result_tests::NoCopy> *)
                    in_RDI._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                    super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                    super__Head_base<0UL,_int_*,_false>._M_head_impl);
  if (bVar2) {
    value(in_RSI);
    result_tests::NoCopy::NoCopy
              ((NoCopy *)
               this_00._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl,(NoCopy *)0x9753dc);
  }
  else {
    result_tests::NoCopy::NoCopy
              ((NoCopy *)0x9753ee,
               this_00._M_t.super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl._4_4_);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (unique_ptr<int,_std::default_delete<int>_>)
           (unique_ptr<int,_std::default_delete<int>_>)
           in_RDI._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
           super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
           super__Head_base<0UL,_int_*,_false>._M_head_impl;
  }
  __stack_chk_fail();
}

Assistant:

T value_or(U&& default_value) &&
    {
        return has_value() ? std::move(value()) : std::forward<U>(default_value);
    }